

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O3

string * __thiscall
duckdb::FMTFormat::
OP<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
          (string *__return_storage_ptr__,FMTFormat *this,char *format_str,
          vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_true>
          *format_args)

{
  anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
  aVar1;
  long lVar2;
  size_t sVar3;
  basic_string_view<char> format_str_00;
  basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  aVar1 = *(anon_union_8_2_de49483c_for_basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_2
            *)format_str;
  lVar2 = *(long *)(format_str + 8);
  sVar3 = strlen((char *)this);
  local_238 = 0;
  local_248 = &PTR_grow_01967680;
  local_230 = 500;
  format_str_00.size_ = sVar3;
  format_str_00.data_ = (char *)this;
  args.field_1.values_ = aVar1.values_;
  args.types_ = (ulong)(lVar2 - (long)aVar1) >> 5 & 0xffffffff | 0x8000000000000000;
  local_240 = local_228;
  duckdb_fmt::v6::
  vformat_to<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
            ((range)&local_248,format_str_00,args,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_240,local_240 + local_238);
  local_248 = &PTR_grow_01967680;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

static string OP(const char *format_str, vector<duckdb_fmt::basic_format_arg<CTX>> &format_args) {
		return duckdb_fmt::vformat(
		    format_str, duckdb_fmt::basic_format_args<CTX>(format_args.data(), static_cast<int>(format_args.size())));
	}